

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O3

void __thiscall duckdb::TableScanState::~TableScanState(TableScanState *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Head_base<0UL,_duckdb::ColumnScanState_*,_false> _Var2;
  unsafe_unique_array<ColumnScanState> *this_00;
  
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector
            (&(this->column_ids).
              super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>);
  ScanFilterInfo::~ScanFilterInfo(&this->filters);
  p_Var1 = (this->checkpoint_lock).internal.
           super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  RandomEngine::~RandomEngine(&(this->local_state).random);
  p_Var1 = (this->local_state).valid_sel.selection_data.internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  _Var2._M_head_impl =
       (this->local_state).column_scans.
       super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
       .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (ColumnScanState *)0x0) {
    ::std::default_delete<duckdb::ColumnScanState[]>::operator()
              ((default_delete<duckdb::ColumnScanState[]> *)&(this->local_state).column_scans,
               _Var2._M_head_impl);
  }
  (this->local_state).column_scans.
  super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
  .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl = (ColumnScanState *)0x0;
  RandomEngine::~RandomEngine(&(this->table_state).random);
  p_Var1 = (this->table_state).valid_sel.selection_data.internal.
           super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  _Var2._M_head_impl =
       (this->table_state).column_scans.
       super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
       .super__Head_base<0UL,_duckdb::ColumnScanState_*,_false>._M_head_impl;
  this_00 = &(this->table_state).column_scans;
  if (_Var2._M_head_impl != (ColumnScanState *)0x0) {
    ::std::default_delete<duckdb::ColumnScanState[]>::operator()
              ((default_delete<duckdb::ColumnScanState[]> *)this_00,_Var2._M_head_impl);
  }
  (this_00->
  super_unique_ptr<duckdb::ColumnScanState[],_std::default_delete<duckdb::ColumnScanState[]>_>)._M_t
  .super___uniq_ptr_impl<duckdb::ColumnScanState,_std::default_delete<duckdb::ColumnScanState[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
       = (_Tuple_impl<0UL,_duckdb::ColumnScanState_*,_std::default_delete<duckdb::ColumnScanState[]>_>
          )0x0;
  return;
}

Assistant:

TableScanState::~TableScanState() {
}